

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableModel::setRowCount(QTableModel *this,int rows)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)(this->verticalHeaderItems).d.size;
  if (iVar1 != rows && -1 < rows) {
    if (iVar1 < rows) {
      iVar3 = 0;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      (**(code **)(*(long *)this + 0xf8))(this,iVar3,rows - iVar1);
    }
    else {
      (**(code **)(*(long *)this + 0x108))(this,rows);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::setRowCount(int rows)
{
    int rc = verticalHeaderItems.size();
    if (rows < 0 || rc == rows)
        return;
    if (rc < rows)
        insertRows(qMax(rc, 0), rows - rc);
    else
        removeRows(qMax(rows, 0), rc - rows);
}